

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O3

CURLHcode curl_easy_header(CURL_conflict *easy,char *name,size_t nameindex,uint type,int request,
                          curl_header **hout)

{
  Curl_llist *list;
  void *pvVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  CURLHcode CVar5;
  size_t sVar6;
  Curl_llist_element *pCVar7;
  Curl_easy *data;
  Curl_llist_element *pCVar8;
  int iVar9;
  ulong local_58;
  void *local_48;
  
  CVar5 = CURLHE_BAD_ARGUMENT;
  if ((((-2 < request) && (0xffffffe0 < type - 0x20)) && (easy != (CURL_conflict *)0x0)) &&
     ((name != (char *)0x0 && (hout != (curl_header **)0x0)))) {
    list = &(easy->state).httphdrs;
    sVar6 = Curl_llist_count(list);
    if (sVar6 == 0) {
      CVar5 = CURLHE_NOHEADERS;
    }
    else {
      iVar9 = (easy->state).requests;
      CVar5 = CURLHE_NOREQUEST;
      if (request <= iVar9) {
        if (request != -1) {
          iVar9 = request;
        }
        pCVar8 = list->head;
        if (pCVar8 != (Curl_llist_element *)0x0) {
          local_48 = (void *)0x0;
          local_58 = 0;
          pCVar7 = (Curl_llist_element *)0x0;
          do {
            pvVar1 = pCVar8->ptr;
            iVar3 = Curl_strcasecompare(*(char **)((long)pvVar1 + 0x18),name);
            if (((iVar3 != 0) && ((*(byte *)((long)pvVar1 + 0x2c) & type) != 0)) &&
               (*(int *)((long)pvVar1 + 0x28) == iVar9)) {
              local_58 = local_58 + 1;
              pCVar7 = pCVar8;
              local_48 = pvVar1;
            }
            pCVar8 = pCVar8->next;
          } while (pCVar8 != (Curl_llist_element *)0x0);
          if (local_58 != 0) {
            if (local_58 <= nameindex) {
              return CURLHE_BADINDEX;
            }
            if (local_58 - 1 == nameindex) {
              uVar4 = (uint)*(byte *)((long)local_48 + 0x2c);
LAB_0052dd9c:
              *hout = &(easy->state).headerout;
              pcVar2 = *(char **)((long)local_48 + 0x20);
              (easy->state).headerout.name = *(char **)((long)local_48 + 0x18);
              (easy->state).headerout.value = pcVar2;
              (easy->state).headerout.amount = local_58;
              (easy->state).headerout.index = nameindex;
              (easy->state).headerout.origin = uVar4 | 0x8000000;
              (easy->state).headerout.anchor = pCVar7;
              return CURLHE_OK;
            }
            pCVar7 = list->head;
            if (pCVar7 != (Curl_llist_element *)0x0) {
              sVar6 = 0;
              do {
                local_48 = pCVar7->ptr;
                iVar3 = Curl_strcasecompare(*(char **)((long)local_48 + 0x18),name);
                if (((iVar3 != 0) &&
                    (uVar4 = (uint)*(byte *)((long)local_48 + 0x2c), (uVar4 & type) != 0)) &&
                   (*(int *)((long)local_48 + 0x28) == iVar9)) {
                  if (sVar6 == nameindex) goto LAB_0052dd9c;
                  sVar6 = sVar6 + 1;
                }
                pCVar7 = pCVar7->next;
              } while (pCVar7 != (Curl_llist_element *)0x0);
            }
          }
        }
        CVar5 = CURLHE_MISSING;
      }
    }
  }
  return CVar5;
}

Assistant:

CURLHcode curl_easy_header(CURL *easy,
                           const char *name,
                           size_t nameindex,
                           unsigned int type,
                           int request,
                           struct curl_header **hout)
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *e_pick = NULL;
  struct Curl_easy *data = easy;
  size_t match = 0;
  size_t amount = 0;
  struct Curl_header_store *hs = NULL;
  struct Curl_header_store *pick = NULL;
  if(!name || !hout || !data ||
     (type > (CURLH_HEADER|CURLH_TRAILER|CURLH_CONNECT|CURLH_1XX|
              CURLH_PSEUDO)) || !type || (request < -1))
    return CURLHE_BAD_ARGUMENT;
  if(!Curl_llist_count(&data->state.httphdrs))
    return CURLHE_NOHEADERS; /* no headers available */
  if(request > data->state.requests)
    return CURLHE_NOREQUEST;
  if(request == -1)
    request = data->state.requests;

  /* we need a first round to count amount of this header */
  for(e = data->state.httphdrs.head; e; e = e->next) {
    hs = e->ptr;
    if(strcasecompare(hs->name, name) &&
       (hs->type & type) &&
       (hs->request == request)) {
      amount++;
      pick = hs;
      e_pick = e;
    }
  }
  if(!amount)
    return CURLHE_MISSING;
  else if(nameindex >= amount)
    return CURLHE_BADINDEX;

  if(nameindex == amount - 1)
    /* if the last or only occurrence is what's asked for, then we know it */
    hs = pick;
  else {
    for(e = data->state.httphdrs.head; e; e = e->next) {
      hs = e->ptr;
      if(strcasecompare(hs->name, name) &&
         (hs->type & type) &&
         (hs->request == request) &&
         (match++ == nameindex)) {
        e_pick = e;
        break;
      }
    }
    if(!e) /* this shouldn't happen */
      return CURLHE_MISSING;
  }
  /* this is the name we want */
  copy_header_external(data, hs, nameindex, amount, e_pick, hout);
  return CURLHE_OK;
}